

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O0

void spvtools::utils::AppendToVector
               (string *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  ulong uVar1;
  byte *pbVar2;
  byte local_32;
  ulong uStack_30;
  uint8_t new_byte;
  size_t byte_index;
  size_t num_bytes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  uint32_t word;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result_local;
  string *input_local;
  
  num_bytes._4_4_ = 0;
  pvStack_18 = result;
  result_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)input;
  uVar1 = std::__cxx11::string::size();
  for (uStack_30 = 0; uStack_30 <= uVar1; uStack_30 = uStack_30 + 1) {
    if (uStack_30 < uVar1) {
      pbVar2 = (byte *)std::__cxx11::string::operator[]((ulong)result_local);
      local_32 = *pbVar2;
    }
    else {
      local_32 = 0;
    }
    num_bytes._4_4_ = (uint)local_32 << (sbyte)((uStack_30 & 3) << 3) | num_bytes._4_4_;
    if ((uStack_30 & 3) == 3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvStack_18,(value_type_conflict *)((long)&num_bytes + 4));
      num_bytes._4_4_ = 0;
    }
  }
  if ((uVar1 + 1 & 3) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (pvStack_18,(value_type_conflict *)((long)&num_bytes + 4));
  }
  return;
}

Assistant:

inline void AppendToVector(const std::string& input,
                           std::vector<uint32_t>* result) {
  uint32_t word = 0;
  size_t num_bytes = input.size();
  // SPIR-V strings are null-terminated.  The byte_index == num_bytes
  // case is used to push the terminating null byte.
  for (size_t byte_index = 0; byte_index <= num_bytes; byte_index++) {
    const auto new_byte =
        (byte_index < num_bytes ? uint8_t(input[byte_index]) : uint8_t(0));
    word |= (new_byte << (8 * (byte_index % sizeof(uint32_t))));
    if (3 == (byte_index % sizeof(uint32_t))) {
      result->push_back(word);
      word = 0;
    }
  }
  // Emit a trailing partial word.
  if ((num_bytes + 1) % sizeof(uint32_t)) {
    result->push_back(word);
  }
}